

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

size_t FSE_buildDTable_internal
                 (FSE_DTable *dt,short *normalizedCounter,uint maxSymbolValue,uint tableLog,
                 void *workSpace,size_t wkspSize)

{
  ushort uVar1;
  undefined1 auVar2 [16];
  size_t sVar3;
  long lVar4;
  byte bVar5;
  byte bVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  int iVar11;
  undefined2 uVar12;
  size_t s_1;
  ulong uVar13;
  short sVar14;
  ulong uVar15;
  long lVar16;
  uint uVar17;
  long lVar18;
  size_t u;
  U32 s;
  ulong uVar19;
  undefined1 in_XMM0 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  
  bVar5 = (byte)tableLog;
  uVar17 = 1 << (bVar5 & 0x1f);
  sVar3 = 0xffffffffffffffd2;
  if (maxSymbolValue < 0x100) {
    uVar8 = maxSymbolValue + 1;
    if (((1L << (bVar5 & 0x3f)) + (ulong)uVar8 * 2 + 8 <= wkspSize) &&
       (sVar3 = 0xffffffffffffffd4, tableLog < 0xd)) {
      lVar4 = (long)workSpace + (ulong)maxSymbolValue * 2 + 2;
      uVar10 = uVar17 - 1;
      uVar12 = 1;
      uVar19 = 0;
      uVar7 = uVar10;
      do {
        sVar14 = normalizedCounter[uVar19];
        if (sVar14 == -1) {
          uVar9 = (ulong)uVar7;
          uVar7 = uVar7 - 1;
          *(char *)((long)dt + uVar9 * 4 + 6) = (char)uVar19;
          sVar14 = 1;
        }
        else if ((0x10000 << (bVar5 - 1 & 0x1f)) >> 0x10 <= (int)sVar14) {
          uVar12 = 0;
        }
        *(short *)((long)workSpace + uVar19 * 2) = sVar14;
        uVar19 = uVar19 + 1;
      } while (uVar8 != uVar19);
      *(short *)dt = (short)tableLog;
      *(undefined2 *)((long)dt + 2) = uVar12;
      auVar2 = _DAT_0027d800;
      if (uVar7 == uVar10) {
        uVar19 = 1;
        if (1 < uVar8) {
          uVar19 = (ulong)uVar8;
        }
        iVar11 = (uVar17 >> 3) + (uVar17 >> 1) + 3;
        uVar9 = 0;
        auVar20 = pmovsxbq(in_XMM0,0x100);
        lVar16 = 0;
        lVar18 = 0;
        do {
          uVar1 = normalizedCounter[uVar9];
          *(long *)(lVar4 + lVar16) = lVar18;
          if (8 < (long)(short)uVar1) {
            uVar8 = 0x10;
            if (0x10 < uVar1) {
              uVar8 = (int)(short)uVar1;
            }
            uVar13 = (ulong)(uVar8 & 0xffff) - 9;
            auVar23._8_4_ = (int)uVar13;
            auVar23._0_8_ = uVar13;
            auVar23._12_4_ = (int)(uVar13 >> 0x20);
            auVar21._0_8_ = uVar13 >> 3;
            auVar21._8_8_ = auVar23._8_8_ >> 3;
            auVar21 = auVar21 ^ auVar2;
            uVar15 = 0;
            do {
              auVar22._8_4_ = (int)uVar15;
              auVar22._0_8_ = uVar15;
              auVar22._12_4_ = (int)(uVar15 >> 0x20);
              auVar23 = (auVar22 | auVar20) ^ auVar2;
              if ((bool)(~(auVar21._4_4_ < auVar23._4_4_ ||
                          auVar21._0_4_ < auVar23._0_4_ && auVar23._4_4_ == auVar21._4_4_) & 1)) {
                *(long *)(lVar4 + lVar16 + 8 + uVar15 * 8) = lVar18;
              }
              if (auVar23._12_4_ <= auVar21._12_4_ &&
                  (auVar23._8_4_ <= auVar21._8_4_ || auVar23._12_4_ != auVar21._12_4_)) {
                *(long *)(lVar4 + lVar16 + 0x10 + uVar15 * 8) = lVar18;
              }
              uVar15 = uVar15 + 2;
            } while (((uVar13 >> 3) + 2 & 0xfffffffffffffffe) != uVar15);
          }
          lVar16 = lVar16 + (short)uVar1;
          uVar9 = uVar9 + 1;
          lVar18 = lVar18 + 0x101010101010101;
        } while (uVar9 != uVar19);
        uVar19 = 0;
        uVar8 = 0;
        do {
          lVar16 = 0;
          uVar7 = uVar8;
          do {
            *(undefined1 *)((long)dt + (ulong)(uVar7 & uVar10) * 4 + 6) =
                 *(undefined1 *)(lVar4 + lVar16);
            lVar16 = lVar16 + 1;
            uVar7 = uVar7 + iVar11;
          } while (lVar16 == 1);
          uVar8 = uVar8 + iVar11 * 2 & uVar10;
          uVar19 = uVar19 + 2;
          lVar4 = lVar4 + 2;
        } while (uVar19 < uVar17);
      }
      else {
        uVar19 = 1;
        if (1 < uVar8) {
          uVar19 = (ulong)uVar8;
        }
        uVar9 = 0;
        uVar13 = 0;
        do {
          sVar14 = normalizedCounter[uVar9];
          if (0 < sVar14) {
            iVar11 = 0;
            do {
              *(char *)((long)dt + uVar13 * 4 + 6) = (char)uVar9;
              do {
                uVar8 = (int)uVar13 + (uVar17 >> 3) + (uVar17 >> 1) + 3 & uVar10;
                uVar13 = (ulong)uVar8;
              } while (uVar7 < uVar8);
              iVar11 = iVar11 + 1;
            } while (iVar11 != sVar14);
          }
          uVar9 = uVar9 + 1;
        } while (uVar9 != uVar19);
        if ((int)uVar13 != 0) {
          return 0xffffffffffffffff;
        }
      }
      sVar3 = 0;
      uVar19 = 0;
      do {
        uVar9 = (ulong)*(byte *)((long)dt + uVar19 * 4 + 6);
        uVar1 = *(ushort *)((long)workSpace + uVar9 * 2);
        *(ushort *)((long)workSpace + uVar9 * 2) = uVar1 + 1;
        iVar11 = 0x1f;
        if (uVar1 != 0) {
          for (; uVar1 >> iVar11 == 0; iVar11 = iVar11 + -1) {
          }
        }
        bVar6 = bVar5 - (char)iVar11;
        *(byte *)((long)dt + uVar19 * 4 + 7) = bVar6;
        *(ushort *)(dt + uVar19 + 1) = (uVar1 << (bVar6 & 0x1f)) - (short)uVar17;
        uVar19 = uVar19 + 1;
      } while (uVar17 != uVar19);
    }
  }
  return sVar3;
}

Assistant:

static size_t FSE_buildDTable_internal(FSE_DTable* dt, const short* normalizedCounter, unsigned maxSymbolValue, unsigned tableLog, void* workSpace, size_t wkspSize)
{
    void* const tdPtr = dt+1;   /* because *dt is unsigned, 32-bits aligned on 32-bits */
    FSE_DECODE_TYPE* const tableDecode = (FSE_DECODE_TYPE*) (tdPtr);
    U16* symbolNext = (U16*)workSpace;
    BYTE* spread = (BYTE*)(symbolNext + maxSymbolValue + 1);

    U32 const maxSV1 = maxSymbolValue + 1;
    U32 const tableSize = 1 << tableLog;
    U32 highThreshold = tableSize-1;

    /* Sanity Checks */
    if (FSE_BUILD_DTABLE_WKSP_SIZE(tableLog, maxSymbolValue) > wkspSize) return ERROR(maxSymbolValue_tooLarge);
    if (maxSymbolValue > FSE_MAX_SYMBOL_VALUE) return ERROR(maxSymbolValue_tooLarge);
    if (tableLog > FSE_MAX_TABLELOG) return ERROR(tableLog_tooLarge);

    /* Init, lay down lowprob symbols */
    {   FSE_DTableHeader DTableH;
        DTableH.tableLog = (U16)tableLog;
        DTableH.fastMode = 1;
        {   S16 const largeLimit= (S16)(1 << (tableLog-1));
            U32 s;
            for (s=0; s<maxSV1; s++) {
                if (normalizedCounter[s]==-1) {
                    tableDecode[highThreshold--].symbol = (FSE_FUNCTION_TYPE)s;
                    symbolNext[s] = 1;
                } else {
                    if (normalizedCounter[s] >= largeLimit) DTableH.fastMode=0;
                    symbolNext[s] = normalizedCounter[s];
        }   }   }
        ZSTD_memcpy(dt, &DTableH, sizeof(DTableH));
    }

    /* Spread symbols */
    if (highThreshold == tableSize - 1) {
        size_t const tableMask = tableSize-1;
        size_t const step = FSE_TABLESTEP(tableSize);
        /* First lay down the symbols in order.
         * We use a uint64_t to lay down 8 bytes at a time. This reduces branch
         * misses since small blocks generally have small table logs, so nearly
         * all symbols have counts <= 8. We ensure we have 8 bytes at the end of
         * our buffer to handle the over-write.
         */
        {
            U64 const add = 0x0101010101010101ull;
            size_t pos = 0;
            U64 sv = 0;
            U32 s;
            for (s=0; s<maxSV1; ++s, sv += add) {
                int i;
                int const n = normalizedCounter[s];
                MEM_write64(spread + pos, sv);
                for (i = 8; i < n; i += 8) {
                    MEM_write64(spread + pos + i, sv);
                }
                pos += n;
            }
        }
        /* Now we spread those positions across the table.
         * The benefit of doing it in two stages is that we avoid the
         * variable size inner loop, which caused lots of branch misses.
         * Now we can run through all the positions without any branch misses.
         * We unroll the loop twice, since that is what empirically worked best.
         */
        {
            size_t position = 0;
            size_t s;
            size_t const unroll = 2;
            assert(tableSize % unroll == 0); /* FSE_MIN_TABLELOG is 5 */
            for (s = 0; s < (size_t)tableSize; s += unroll) {
                size_t u;
                for (u = 0; u < unroll; ++u) {
                    size_t const uPosition = (position + (u * step)) & tableMask;
                    tableDecode[uPosition].symbol = spread[s + u];
                }
                position = (position + (unroll * step)) & tableMask;
            }
            assert(position == 0);
        }
    } else {
        U32 const tableMask = tableSize-1;
        U32 const step = FSE_TABLESTEP(tableSize);
        U32 s, position = 0;
        for (s=0; s<maxSV1; s++) {
            int i;
            for (i=0; i<normalizedCounter[s]; i++) {
                tableDecode[position].symbol = (FSE_FUNCTION_TYPE)s;
                position = (position + step) & tableMask;
                while (position > highThreshold) position = (position + step) & tableMask;   /* lowprob area */
        }   }
        if (position!=0) return ERROR(GENERIC);   /* position must reach all cells once, otherwise normalizedCounter is incorrect */
    }

    /* Build Decoding table */
    {   U32 u;
        for (u=0; u<tableSize; u++) {
            FSE_FUNCTION_TYPE const symbol = (FSE_FUNCTION_TYPE)(tableDecode[u].symbol);
            U32 const nextState = symbolNext[symbol]++;
            tableDecode[u].nbBits = (BYTE) (tableLog - ZSTD_highbit32(nextState) );
            tableDecode[u].newState = (U16) ( (nextState << tableDecode[u].nbBits) - tableSize);
    }   }

    return 0;
}